

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O0

TapBranchInfoStruct *
cfd::js::api::AddressStructApi::GetTapBranchInfo
          (TapBranchInfoStruct *__return_storage_ptr__,GetTapBranchInfoRequestStruct *request)

{
  GetTapBranchInfoRequestStruct *this;
  string *in_R8;
  allocator local_161;
  function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
  local_160;
  undefined1 local_140 [295];
  undefined1 local_19;
  GetTapBranchInfoRequestStruct *local_18;
  GetTapBranchInfoRequestStruct *request_local;
  TapBranchInfoStruct *result;
  
  local_19 = 0;
  local_18 = request;
  request_local = (GetTapBranchInfoRequestStruct *)__return_storage_ptr__;
  TapBranchInfoStruct::TapBranchInfoStruct(__return_storage_ptr__);
  this = local_18;
  std::
  function<cfd::js::api::TapBranchInfoStruct(cfd::js::api::GetTapBranchInfoRequestStruct_const&)>::
  function<cfd::js::api::AddressStructApi::GetTapBranchInfo(cfd::js::api::GetTapBranchInfoRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::TapBranchInfoStruct(cfd::js::api::GetTapBranchInfoRequestStruct_const&)>
              *)local_140,
             (anon_class_1_0_00000001 *)
             &GetTapBranchInfo(cfd::js::api::GetTapBranchInfoRequestStruct_const&)::call_func);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"GetTapBranchInfo",&local_161);
  ExecuteStructApi<cfd::js::api::GetTapBranchInfoRequestStruct,cfd::js::api::TapBranchInfoStruct>
            ((TapBranchInfoStruct *)(local_140 + 0x20),(api *)this,
             (GetTapBranchInfoRequestStruct *)local_140,&local_160,in_R8);
  TapBranchInfoStruct::operator=(__return_storage_ptr__,(TapBranchInfoStruct *)(local_140 + 0x20));
  TapBranchInfoStruct::~TapBranchInfoStruct((TapBranchInfoStruct *)(local_140 + 0x20));
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::
  function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
  ::~function((function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
               *)local_140);
  return __return_storage_ptr__;
}

Assistant:

TapBranchInfoStruct AddressStructApi::GetTapBranchInfo(
    const GetTapBranchInfoRequestStruct& request) {
  static auto call_func = [](const GetTapBranchInfoRequestStruct& request)
      -> TapBranchInfoStruct {  // NOLINT
    TapBranchInfoStruct result;
    if (request.tree_string.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. tree string is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "tree string is empty.");
    }
    TaprootScriptTree tree;
    TapBranch branch;
    TapBranch* branch_ptr;
    if (request.tapscript.empty()) {
      branch = TapBranch::FromString(request.tree_string);
      branch_ptr = &branch;
    } else {
      std::vector<ByteData256> nodes;
      for (const auto& node : request.nodes) {
        nodes.emplace_back(ByteData256(node));
      }
      tree = TaprootScriptTree::FromString(
          request.tree_string, Script(request.tapscript), nodes);
      branch_ptr = &tree;
    }

    auto branches = branch_ptr->GetBranchList();
    if (request.index >= static_cast<uint32_t>(branches.size())) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. index is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "index is out of range.");
    }
    auto target_branch = branches[request.index];
    result.tree_string = target_branch.ToString();
    result.top_branch_hash = target_branch.GetCurrentBranchHash().GetHex();
    for (const auto& node : target_branch.GetNodeList()) {
      result.nodes.emplace_back(node.GetHex());
    }
    return result;
  };

  TapBranchInfoStruct result;
  result =
      ExecuteStructApi<GetTapBranchInfoRequestStruct, TapBranchInfoStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}